

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

bool __thiscall nuraft::raft_server::check_leadership_validity(raft_server *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  srv_role sVar4;
  int32 iVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  size_type sVar9;
  element_type *peVar10;
  long in_RDI;
  int32 min_quorum_size;
  int32 nr_peers;
  int leadership_expiry;
  int32 num_voting_members;
  unique_lock<std::recursive_mutex> guard;
  int in_stack_000001a8;
  bool in_stack_000001af;
  raft_server *in_stack_000001b0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  unique_lock<std::recursive_mutex> *in_stack_ffffffffffffff00;
  raft_server *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  string local_a0 [24];
  raft_server *in_stack_ffffffffffffff78;
  raft_server *in_stack_ffffffffffffff80;
  string local_60 [32];
  int local_40;
  uint local_3c;
  int local_38;
  uint local_28;
  undefined4 local_24;
  byte local_1;
  
  std::unique_lock<std::recursive_mutex>::unique_lock
            (in_stack_ffffffffffffff00,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  sVar4 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x2b2141);
  if (sVar4 == leader) {
    local_28 = get_num_voting_members
                         ((raft_server *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    local_38 = get_leadership_expiry(in_stack_ffffffffffffff10);
    sVar8 = get_not_responding_peers(in_stack_ffffffffffffff80);
    local_3c = (uint)sVar8;
    if (local_38 < 0) {
      local_3c = 0;
    }
    iVar5 = get_quorum_for_commit(in_stack_ffffffffffffff78);
    local_40 = iVar5 + 1;
    if ((int)(local_28 - local_3c) < local_40) {
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar3) {
        peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2b2245);
        iVar7 = (*peVar10->_vptr_logger[7])();
        if (1 < iVar7) {
          peVar10 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2b2275);
          uVar2 = local_28;
          uVar1 = local_3c;
          sVar9 = std::
                  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                  ::size((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                          *)0x2b22a1);
          uVar6 = get_leadership_expiry(in_stack_ffffffffffffff10);
          msg_if_given_abi_cxx11_
                    ((char *)local_60,
                     "%d nodes (out of %d, %zu including learners) are not responding longer than %d ms, at least %d nodes (including leader) should be alive to proceed commit"
                     ,(ulong)uVar1,(ulong)uVar2,sVar9 + 1,(ulong)uVar6,local_40);
          (*peVar10->_vptr_logger[8])
                    (peVar10,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"check_leadership_validity",0x449,local_60);
          std::__cxx11::string::~string(local_60);
        }
      }
      if (local_40 < (int)local_28) {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar3) {
          peVar10 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2b248a);
          iVar7 = (*peVar10->_vptr_logger[7])();
          if (1 < iVar7) {
            in_stack_ffffffffffffff00 =
                 (unique_lock<std::recursive_mutex> *)
                 std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2b24ba);
            msg_if_given_abi_cxx11_((char *)local_a0,"will yield the leadership of this node");
            (**(_func_int **)
               ((long)&in_stack_ffffffffffffff00->_M_device[1].super___recursive_mutex_base._M_mutex
               + 0x18))(in_stack_ffffffffffffff00,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                        ,"check_leadership_validity",0x454,local_a0);
            std::__cxx11::string::~string(local_a0);
          }
        }
        yield_leadership(in_stack_000001b0,in_stack_000001af,in_stack_000001a8);
        local_1 = 0;
      }
      else {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar3) {
          peVar10 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2b2394);
          iVar7 = (*peVar10->_vptr_logger[7])();
          if (2 < iVar7) {
            peVar10 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x2b23c4);
            msg_if_given_abi_cxx11_
                      (&stack0xffffffffffffff80,
                       "we cannot yield the leadership of this small cluster");
            (*peVar10->_vptr_logger[8])
                      (peVar10,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"check_leadership_validity",0x450,&stack0xffffffffffffff80);
            std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
          }
        }
        local_1 = 1;
      }
    }
    else {
      local_1 = 1;
    }
  }
  else {
    local_1 = 0;
  }
  local_24 = 1;
  std::unique_lock<std::recursive_mutex>::~unique_lock(in_stack_ffffffffffffff00);
  return (bool)(local_1 & 1);
}

Assistant:

bool raft_server::check_leadership_validity() {
    recur_lock(lock_);

    if (role_ != leader)
        return false;

    // Check if quorum is not responding.
    int32 num_voting_members = get_num_voting_members();

    int leadership_expiry = get_leadership_expiry();
    int32 nr_peers = (int32)get_not_responding_peers();
    if (leadership_expiry < 0) {
        // Negative expiry: leadership will never expire.
        nr_peers = 0;
    }
    int32 min_quorum_size = get_quorum_for_commit() + 1;
    if ( (num_voting_members - nr_peers) < min_quorum_size ) {
        p_er("%d nodes (out of %d, %zu including learners) are not "
             "responding longer than %d ms, "
             "at least %d nodes (including leader) should be alive "
             "to proceed commit",
             nr_peers,
             num_voting_members,
             peers_.size() + 1,
             get_leadership_expiry(),
             min_quorum_size);

        // NOTE:
        //   For a cluster where the number of members is the same
        //   as the size of quorum, we should not expire leadership,
        //   since it will block the cluster doing any further actions.
        if (num_voting_members <= min_quorum_size) {
            p_wn("we cannot yield the leadership of this small cluster");
            return true;
        }

        p_er("will yield the leadership of this node");
        yield_leadership(true);
        return false;
    }
    return true;
}